

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void ensureBits32(LodePNGBitReader *reader,size_t nbits)

{
  ulong uVar1;
  ulong uVar2;
  size_t size;
  size_t start;
  size_t nbits_local;
  LodePNGBitReader *reader_local;
  
  uVar2 = reader->bp >> 3;
  uVar1 = reader->size;
  if (uVar2 + 4 < uVar1) {
    reader->buffer =
         CONCAT13(reader->data[uVar2 + 3],
                  CONCAT12(reader->data[uVar2 + 2],
                           CONCAT11(reader->data[uVar2 + 1],reader->data[uVar2])));
    reader->buffer = reader->buffer >> ((byte)reader->bp & 7);
    reader->buffer =
         ((uint)reader->data[uVar2 + 4] << 0x18) << (8 - ((byte)reader->bp & 7) & 0x1f) |
         reader->buffer;
  }
  else {
    reader->buffer = 0;
    if (uVar2 < uVar1) {
      reader->buffer = (uint)reader->data[uVar2] | reader->buffer;
    }
    if (uVar2 + 1 < uVar1) {
      reader->buffer = (uint)reader->data[uVar2 + 1] << 8 | reader->buffer;
    }
    if (uVar2 + 2 < uVar1) {
      reader->buffer = (uint)reader->data[uVar2 + 2] << 0x10 | reader->buffer;
    }
    if (uVar2 + 3 < uVar1) {
      reader->buffer = (uint)reader->data[uVar2 + 3] << 0x18 | reader->buffer;
    }
    reader->buffer = reader->buffer >> ((byte)reader->bp & 7);
  }
  return;
}

Assistant:

static LODEPNG_INLINE void ensureBits32(LodePNGBitReader* reader, size_t nbits) {
  size_t start = reader->bp >> 3u;
  size_t size = reader->size;
  if(start + 4u < size) {
    reader->buffer = (unsigned)reader->data[start + 0] | ((unsigned)reader->data[start + 1] << 8u) |
                     ((unsigned)reader->data[start + 2] << 16u) | ((unsigned)reader->data[start + 3] << 24u);
    reader->buffer >>= (reader->bp & 7u);
    reader->buffer |= (((unsigned)reader->data[start + 4] << 24u) << (8u - (reader->bp & 7u)));
  } else {
    reader->buffer = 0;
    if(start + 0u < size) reader->buffer |= reader->data[start + 0];
    if(start + 1u < size) reader->buffer |= ((unsigned)reader->data[start + 1] << 8u);
    if(start + 2u < size) reader->buffer |= ((unsigned)reader->data[start + 2] << 16u);
    if(start + 3u < size) reader->buffer |= ((unsigned)reader->data[start + 3] << 24u);
    reader->buffer >>= (reader->bp & 7u);
  }
  (void)nbits;
}